

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

RESET_DATA * new_reset_data(void)

{
  uint clearmem;
  RESET_DATA *pReset;
  uint local_c;
  RESET_DATA *local_8;
  
  if (reset_free == (RESET_DATA *)0x0) {
    local_8 = (RESET_DATA *)operator_new(0x18);
    for (local_c = 0; local_c < 0x18; local_c = local_c + 1) {
      *(undefined1 *)((long)&local_8->next + (ulong)local_c) = 0;
    }
    top_reset = top_reset + 1;
  }
  else {
    local_8 = reset_free;
    reset_free = reset_free->next;
  }
  local_8->next = (RESET_DATA *)0x0;
  local_8->command = 'X';
  local_8->arg1 = 0;
  local_8->arg2 = 0;
  local_8->arg3 = 0;
  return local_8;
}

Assistant:

RESET_DATA *new_reset_data(void)
{
	RESET_DATA *pReset;

	if (!reset_free)
	{
		pReset = new RESET_DATA;
		CLEAR_MEM(pReset, sizeof(RESET_DATA))
		top_reset++;
	}
	else
	{
		pReset = reset_free;
		reset_free = reset_free->next;
	}

	pReset->next = nullptr;
	pReset->command = 'X';
	pReset->arg1 = 0;
	pReset->arg2 = 0;
	pReset->arg3 = 0;

	return pReset;
}